

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_wear_recharge(void)

{
  ushort uVar1;
  _Bool *p_Var2;
  _Bool _Var3;
  wchar_t wVar4;
  char *what;
  wchar_t wVar5;
  borg_item_conflict *pbVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  _Var3 = borg_check_rest(borg.c.y,borg.c.x);
  if ((_Var3) && (borg.trait[0x6c] == 0)) {
    wVar5 = L'\xffffffff';
    lVar10 = 0;
    uVar9 = 0;
    uVar8 = 0xffffffff;
    pbVar6 = borg_items;
    do {
      if ((pbVar6->curses[lVar10 + -0x26] != false) &&
         (*(short *)(pbVar6->curses + lVar10 + -0x18) != 0)) {
        wVar4 = borg_wield_slot((borg_item *)(pbVar6->desc + lVar10));
        if (pbVar6->curses[lVar10 + -0x2a] == true) {
          p_Var2 = pbVar6->curses;
          pbVar6 = borg_items;
          if ((sv_light_torch != (uint)p_Var2[lVar10 + -0x29]) &&
             (sv_light_lantern != (uint)p_Var2[lVar10 + -0x29])) goto LAB_0022f46c;
        }
        else if ((pbVar6->curses[lVar10 + -0x2a] != true) ||
                ((sv_rod_recall == (uint)pbVar6->curses[lVar10 + -0x29] ||
                 (pbVar6 = borg_items, borg.trait[0x69] != 0)))) {
LAB_0022f46c:
          uVar8 = uVar9 & 0xffffffff;
          pbVar6 = borg_items;
          wVar5 = wVar4;
        }
      }
      uVar9 = uVar9 + 1;
      uVar1 = z_info->pack_size;
      lVar10 = lVar10 + 0x388;
    } while (uVar9 < (ulong)uVar1 + 0xc);
    iVar7 = (int)uVar8;
    if (iVar7 != -1) {
      if ((iVar7 < (int)(uint)uVar1) && (uVar8 = (ulong)iVar7, pbVar6[uVar8].tval != '\x18')) {
        if (wVar5 < (int)(uint)uVar1) {
          return false;
        }
        borg_note("# Swapping Item for Recharge.");
        borg_keypress(0xe000);
        borg_keypress(0x77);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar8]);
      }
      else {
        what = format("# Waiting for \'%s\' to Recharge.",pbVar6 + uVar8);
        borg_note(what);
      }
      borg_keypress(0x52);
      borg_keypress(0x37);
      borg_keypress(0x35);
      borg_keypress(0x9c);
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_wear_recharge(void)
{
    int i, b_i = -1;
    int slot   = -1;
    int b_slot = -1;

    /* No resting in danger */
    if (!borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* Not if hungry */
    if (borg.trait[BI_ISWEAK])
        return false;

    /* Look for an (wearable- non rod) item to recharge */
    for (i = 0; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip items that are charged */
        if (!item->timeout)
            continue;

        /* Where can it be worn? */
        slot = borg_wield_slot(item);
        
        /* if this is a rod, only count it if it is a rod of recall */
        /* and we are in town.  This is to prevent walking down when */
        /* the borg has a perfectly serviceable rod */
        if (item->tval == TV_ROD && item->sval != sv_rod_recall
            && borg.trait[BI_CDEPTH] == 0)
            continue;

        /* skip non-ego lights, No need to rest to recharge a torch, which uses
         * fuels turns in o_ptr->timeout */
        if (item->tval == TV_LIGHT
            && (item->sval == sv_light_torch || item->sval == sv_light_lantern))
            continue;

        /* note this one */
        b_i    = i;
        b_slot = slot;
    }

    /* nothing found */
    if (b_i == -1)
        return false;

    if (b_i >= INVEN_WIELD || borg_items[b_i].tval == TV_ROD) {
        /* Item is worn, no swap is nec. */
        borg_note(
            format("# Waiting for '%s' to Recharge.", borg_items[b_i].desc));

        /* Rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }
    /* Item must be worn to be recharged
     */
    if (b_slot >= INVEN_WIELD) {

        /* wear the item */
        borg_note("# Swapping Item for Recharge.");
        borg_keypress(ESCAPE);
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }

    /* nothing to recharge */
    return false;
}